

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofSpringConstraint::setEquilibriumPoint(btGeneric6DofSpringConstraint *this,int index)

{
  btScalar *pbVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)index;
  btGeneric6DofConstraint::calculateTransforms(&this->super_btGeneric6DofConstraint);
  pbVar1 = (this->super_btGeneric6DofConstraint).m_calculatedTransformB.m_origin.m_floats +
           uVar2 + 1;
  if (index < 3) {
    uVar2 = (long)index;
    pbVar1 = (this->super_btGeneric6DofConstraint).m_calculatedLinearDiff.m_floats + index;
  }
  this->m_equilibriumPoint[uVar2] = *pbVar1;
  return;
}

Assistant:

void btGeneric6DofSpringConstraint::setEquilibriumPoint(int index)
{
	btAssert((index >= 0) && (index < 6));
	calculateTransforms();
	if(index < 3)
	{
		m_equilibriumPoint[index] = m_calculatedLinearDiff[index];
	}
	else
	{
		m_equilibriumPoint[index] = m_calculatedAxisAngleDiff[index - 3];
	}
}